

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O2

void Gia_ManPrintGetMuxFanins(Gia_Man_t *p,Gia_Obj_t *pObj,int *pFanins)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pData1;
  Gia_Obj_t *pData0;
  Gia_Obj_t *local_30;
  Gia_Obj_t *local_28;
  
  pGVar2 = Gia_ObjRecognizeMux(pObj,&local_30,&local_28);
  iVar1 = Gia_ObjId(p,(Gia_Obj_t *)((ulong)pGVar2 & 0xfffffffffffffffe));
  *pFanins = iVar1;
  iVar1 = Gia_ObjId(p,(Gia_Obj_t *)((ulong)local_30 & 0xfffffffffffffffe));
  pFanins[1] = iVar1;
  iVar1 = Gia_ObjId(p,(Gia_Obj_t *)((ulong)local_28 & 0xfffffffffffffffe));
  pFanins[2] = iVar1;
  return;
}

Assistant:

void Gia_ManPrintGetMuxFanins( Gia_Man_t * p, Gia_Obj_t * pObj, int * pFanins )
{
    Gia_Obj_t * pData0, * pData1;
    Gia_Obj_t * pCtrl = Gia_ObjRecognizeMux( pObj, &pData1, &pData0 );
    pFanins[0] = Gia_ObjId(p, Gia_Regular(pCtrl));
    pFanins[1] = Gia_ObjId(p, Gia_Regular(pData1));
    pFanins[2] = Gia_ObjId(p, Gia_Regular(pData0));
}